

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

int __thiscall
glslang::HlslParseContext::flattenArray
          (HlslParseContext *this,TVariable *variable,TType *type,TFlattenData *flattenData,
          TString *name,bool linkage,TQualifier *outerQualifier)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  size_type sVar5;
  undefined4 extraout_var_00;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_128;
  int local_fc;
  char local_f8 [4];
  int mpos;
  char elementNumBuf [20];
  value_type_conflict6 local_dc;
  int element;
  int local_d4;
  int pos;
  int start;
  TType dereferencedType;
  int size;
  bool linkage_local;
  TString *name_local;
  TFlattenData *flattenData_local;
  TType *type_local;
  TVariable *variable_local;
  HlslParseContext *this_local;
  
  dereferencedType.spirvType._7_1_ = linkage;
  uVar3 = (*type->_vptr_TType[0x1e])();
  if ((uVar3 & 1) != 0) {
    dereferencedType.spirvType._0_4_ = (*type->_vptr_TType[0xf])();
    TType::TType((TType *)&pos,type,0,false);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::empty(name);
    if (bVar2) {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[3])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=(name,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     CONCAT44(extraout_var,iVar4));
    }
    sVar5 = std::vector<int,_glslang::pool_allocator<int>_>::size
                      (&(flattenData->offsets).super_vector<int,_glslang::pool_allocator<int>_>);
    element = (int)sVar5;
    local_dc = -1;
    local_d4 = element;
    std::vector<int,_glslang::pool_allocator<int>_>::resize
              (&(flattenData->offsets).super_vector<int,_glslang::pool_allocator<int>_>,
               (long)(element + (int)dereferencedType.spirvType),&local_dc);
    elementNumBuf[0x10] = '\0';
    elementNumBuf[0x11] = '\0';
    elementNumBuf[0x12] = '\0';
    elementNumBuf[0x13] = '\0';
    for (; iVar4 = local_d4, (int)elementNumBuf._16_4_ < (int)dereferencedType.spirvType;
        elementNumBuf._16_4_ = elementNumBuf._16_4_ + 1) {
      snprintf(local_f8,0x13,"[%d]",(ulong)(uint)elementNumBuf._16_4_);
      std::operator+(&local_128,name,local_f8);
      bVar1 = dereferencedType.spirvType._7_1_;
      iVar4 = (*type->_vptr_TType[0x13])();
      iVar4 = addFlattenedMember(this,variable,(TType *)&pos,flattenData,&local_128,
                                 (bool)(bVar1 & 1),outerQualifier,
                                 (TArraySizes *)CONCAT44(extraout_var_00,iVar4));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_128);
      sVar5 = (size_type)element;
      local_fc = iVar4;
      element = element + 1;
      pvVar6 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                         (&(flattenData->offsets).super_vector<int,_glslang::pool_allocator<int>_>,
                          sVar5);
      *pvVar6 = iVar4;
    }
    TType::~TType((TType *)&pos);
    return iVar4;
  }
  __assert_fail("type.isSizedArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0x52d,
                "int glslang::HlslParseContext::flattenArray(const TVariable &, const TType &, TFlattenData &, TString, bool, const TQualifier &)"
               );
}

Assistant:

int HlslParseContext::flattenArray(const TVariable& variable, const TType& type,
                                   TFlattenData& flattenData, TString name, bool linkage,
                                   const TQualifier& outerQualifier)
{
    assert(type.isSizedArray());

    const int size = type.getOuterArraySize();
    const TType dereferencedType(type, 0);

    if (name.empty())
        name = variable.getName();

    // Reserve space for this tree level.
    int start = static_cast<int>(flattenData.offsets.size());
    int pos   = start;
    flattenData.offsets.resize(int(pos + size), -1);

    for (int element=0; element < size; ++element) {
        char elementNumBuf[20];  // sufficient for MAXINT
        snprintf(elementNumBuf, sizeof(elementNumBuf)-1, "[%d]", element);
        const int mpos = addFlattenedMember(variable, dereferencedType, flattenData,
                                            name + elementNumBuf, linkage, outerQualifier,
                                            type.getArraySizes());

        flattenData.offsets[pos++] = mpos;
    }

    return start;
}